

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcmesh.cpp
# Opt level: O1

int __thiscall TPZCompMesh::InsertMaterialObject(TPZCompMesh *this,TPZMaterial *mat)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppTVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int matid;
  int local_1c;
  
  if (mat == (TPZMaterial *)0x0) {
    return -1;
  }
  local_1c = (**(code **)(*(long *)mat + 0x58))(mat);
  p_Var1 = &(this->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < local_1c])
  {
    if (local_1c <= (int)p_Var4[1]._M_color) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, local_1c < (int)p_Var3[1]._M_color)
     ) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcmesh.cpp",
               0x170);
  }
  ppTVar2 = std::
            map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
            ::operator[](&this->fMaterialVec,&local_1c);
  *ppTVar2 = mat;
  return (int)(this->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

int TPZCompMesh::InsertMaterialObject(TPZMaterial * mat) {
	if(!mat) return -1;
	int matid = mat->Id();
    if (fMaterialVec.find(matid) != fMaterialVec.end()) {
        DebugStop();
    }
	fMaterialVec[matid] = mat;
	return fMaterialVec.size();
}